

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

Tensor<double> * __thiscall
scp::Tensor<double>::operator=(Tensor<double> *this,Tensor<double> *tensor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint64_t *puVar6;
  double *pdVar7;
  Tensor<double> *tensor_local;
  Tensor<double> *this_local;
  
  if (((this->_shape).order == (tensor->_shape).order) && (this->_length == tensor->_length)) {
    bVar3 = std::equal<unsigned_long*,unsigned_long*>
                      ((this->_shape).sizes,(this->_shape).sizes + (this->_shape).order,
                       (tensor->_shape).sizes);
    if (!bVar3) {
      std::copy_n<unsigned_long*,unsigned_long,unsigned_long*>
                ((tensor->_shape).sizes,(this->_shape).order,(this->_shape).sizes);
    }
  }
  else {
    if ((this->_owner & 1U) == 0) {
      __assert_fail("_owner",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                    ,0xe3,
                    "Tensor<TValue> &scp::Tensor<double>::operator=(const Tensor<TValue> &) [TValue = double]"
                   );
    }
    puVar6 = (this->_shape).sizes;
    if (puVar6 != (uint64_t *)0x0) {
      operator_delete__(puVar6);
    }
    if (this->_values != (double *)0x0) {
      operator_delete__(this->_values);
    }
    (this->_shape).order = (tensor->_shape).order;
    iVar4 = std::accumulate<unsigned_long*,int,std::multiplies<unsigned_long>>
                      ((tensor->_shape).sizes,(tensor->_shape).sizes + (tensor->_shape).order,1);
    this->_length = (long)iVar4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->_shape).order;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    puVar6 = (uint64_t *)operator_new__(uVar5);
    (this->_shape).sizes = puVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->_length;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar7 = (double *)operator_new__(uVar5);
    this->_values = pdVar7;
    this->_owner = true;
    std::copy_n<unsigned_long*,unsigned_long,unsigned_long*>
              ((tensor->_shape).sizes,(this->_shape).order,(this->_shape).sizes);
  }
  std::copy_n<double*,unsigned_long,double*>(tensor->_values,this->_length,this->_values);
  return this;
}

Assistant:

constexpr Tensor<TValue>& Tensor<TValue>::operator=(const Tensor<TValue>& tensor)
	{
		if (_shape.order != tensor._shape.order || _length != tensor._length)
		{
			assert(_owner);

			delete[] _shape.sizes;
			delete[] _values;

			_shape.order = tensor._shape.order;
			_length = std::accumulate(tensor._shape.sizes, tensor._shape.sizes + tensor._shape.order, 1, std::multiplies<uint64_t>());
			_shape.sizes = new uint64_t[_shape.order];
			_values = new TValue[_length];
			_owner = true;

			std::copy_n(tensor._shape.sizes, _shape.order, _shape.sizes);
		}
		else if (!std::equal(_shape.sizes, _shape.sizes + _shape.order, tensor._shape.sizes))
		{
			std::copy_n(tensor._shape.sizes, _shape.order, _shape.sizes);
		}

		std::copy_n(tensor._values, _length, _values);

		return *this;
	}